

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

bool cppcms::b64url::decode(string *input,string *output)

{
  size_t s;
  uchar *begin_00;
  long lVar1;
  allocator_type *__a;
  reference pvVar2;
  char *in_RSI;
  uchar *outbuf;
  vector<char,_std::allocator<char>_> buf;
  uchar *end;
  uchar *begin;
  int ds;
  uchar *in_stack_ffffffffffffff78;
  vector<char,_std::allocator<char>_> *this;
  size_type in_stack_ffffffffffffff98;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_4a [26];
  uchar *local_30;
  uchar *local_28;
  int local_1c;
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  s = std::__cxx11::string::size();
  local_1c = decoded_size(s);
  if (local_1c < 0) {
    local_1 = 0;
  }
  else if (local_1c == 0) {
    local_1 = 1;
  }
  else {
    begin_00 = (uchar *)std::__cxx11::string::c_str();
    local_28 = begin_00;
    lVar1 = std::__cxx11::string::size();
    local_30 = begin_00 + lVar1;
    __a = (allocator_type *)(long)local_1c;
    local_4a[1] = 0;
    this = (vector<char,_std::allocator<char>_> *)local_4a;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(value_type_conflict *)this,__a);
    std::allocator<char>::~allocator((allocator<char> *)local_4a);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(local_4a + 2),0);
    decode(begin_00,in_stack_ffffffffffffff78,(uchar *)0x3ced7c);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_4a + 2),0);
    std::__cxx11::string::assign(local_18,(ulong)pvVar2);
    local_1 = 1;
    std::vector<char,_std::allocator<char>_>::~vector(this);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CPPCMS_API decode(std::string const &input,std::string &output)
{
	int ds = decoded_size(input.size());
	if(ds < 0)
		return false;
	if(ds == 0)
		return true;
	unsigned char const *begin = reinterpret_cast<unsigned char const *>(input.c_str());
	unsigned char const *end = begin + input.size();
	std::vector<char> buf(ds,0);
	unsigned char *outbuf =  reinterpret_cast<unsigned char *>(&buf[0]);
	decode(begin,end,outbuf);
	output.assign(&buf[0],ds);
	return true;
}